

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O3

ScalarFunction * duckdb::GetBitFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe7c;
  FunctionNullHandling in_stack_fffffffffffffe88;
  bind_lambda_function_t in_stack_fffffffffffffe90;
  scalar_function_t local_168;
  LogicalType local_148;
  vector<duckdb::LogicalType,_true> local_130;
  LogicalType local_118;
  LogicalType local_100 [2];
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(local_100,BIT);
  LogicalType::LogicalType(local_100 + 1,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_100;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_130,__l,
             (allocator_type *)&stack0xfffffffffffffe97);
  LogicalType::LogicalType(&local_148,INTEGER);
  local_168.super__Function_base._M_functor._8_8_ = 0;
  local_168.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::BinaryFunction<duckdb::string_t,int,int,duckdb::GetBitOperator>;
  local_168._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_168.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_118,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_118;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe74;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe7c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_130,&local_148,&local_168,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90);
  LogicalType::~LogicalType(&local_118);
  if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.super__Function_base._M_manager)
              ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_148);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_130);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_100[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction GetBitFun::GetFunction() {
	ScalarFunction func({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::INTEGER,
	                    ScalarFunction::BinaryFunction<string_t, int32_t, int32_t, GetBitOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}